

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
          (CreatePBufferSurface *this,EGLDisplay display,EGLConfig config,EGLint width,EGLint height
          ,SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface)

{
  Surface *this_00;
  SharedPtr<tcu::ThreadUtil::Event> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_40;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"CreatePBufferSurface");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__CreatePBufferSurface_003d5db0;
  this->m_display = display;
  this->m_config = config;
  this->m_width = width;
  this->m_height = height;
  (this->m_surface).m_ptr = (Surface *)0x0;
  (this->m_surface).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (Surface *)operator_new(0x40);
  local_50.m_ptr = (this->super_Operation).m_event.m_ptr;
  local_50.m_state = (this->super_Operation).m_event.m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Surface::Surface(this_00,&local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&local_40,this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=(surface,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_40);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=(&this->m_surface,surface);
  return;
}

Assistant:

CreatePBufferSurface::CreatePBufferSurface (EGLDisplay display, EGLConfig config, EGLint width, EGLint height, SharedPtr<Surface>& surface)
	: tcu::ThreadUtil::Operation	("CreatePBufferSurface")
	, m_display					(display)
	, m_config					(config)
	, m_width					(width)
	, m_height					(height)
{
	surface = SharedPtr<Surface>(new Surface(getEvent()));
	m_surface = surface;
}